

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::Int32Size(RepeatedField<int> *value)

{
  int n;
  const_pointer data;
  size_t sVar1;
  
  data = RepeatedField<int>::data(value);
  n = RepeatedField<int>::size(value);
  sVar1 = VarintSize<false,true,int>(data,n);
  return sVar1;
}

Assistant:

size_t WireFormatLite::Int32Size(const RepeatedField<int32_t>& value) {
  return VarintSize<false, true>(value.data(), value.size());
}